

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool __thiscall bioparser::Parser<biosoup::Sequence>::Read(Parser<biosoup::Sequence> *this)

{
  pointer pcVar1;
  uint uVar2;
  
  this->buffer_ptr_ = 0;
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = gzread((this->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
                 super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
                 super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl,pcVar1,
                 *(int *)&(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (int)pcVar1);
  this->buffer_bytes_ = uVar2;
  return (ulong)uVar2 <
         (ulong)((long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
}

Assistant:

bool Read() {
    buffer_ptr_ = 0;
    buffer_bytes_ = gzread(file_.get(), buffer_.data(), buffer_.size());
    return buffer_bytes_ < buffer_.size();
  }